

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionForceTorque
          (ChElementBeamEuler *this,double eta,ChVector<double> *Fforce,ChVector<double> *Mtorque)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChElementBeamEuler *pCVar12;
  int iVar13;
  Scalar *pSVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  ulong in_XMM0_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ChVectorDynamic<> displ_ec;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> sect_ek;
  ChVectorN<double,_6> wrench;
  ChMatrixNM<double,_6,_6> Klaw_d;
  ChMatrix33<double> Rotsect0;
  ChMatrixNM<double,_6,_6> RotsectA;
  ChMatrixNM<double,_6,_6> Klaw_r;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_12,_12> T;
  ChMatrixNM<double,_12,_12> Tc;
  ChMatrixNM<double,_6,_6> TA;
  ChMatrixNM<double,_6,_6> TsA;
  ChMatrixNM<double,_6,_6> TcA;
  ChMatrixNM<double,_12,_12> Ts;
  void *local_1b48 [2];
  ChElementBeamEuler *local_1b38;
  undefined1 local_1b30 [16];
  undefined1 local_1b20 [16];
  LhsNested local_1b10;
  ulong uStack_1b08;
  undefined1 local_1b00 [8];
  double dStack_1af8;
  double local_1ae8;
  LhsNested local_1ae0;
  undefined8 uStack_1ad8;
  undefined1 local_1ad0 [16];
  ChVector<double> *local_1ac0;
  ChVector<double> *local_1ab8;
  Scalar local_1ab0;
  Scalar local_1aa8;
  LhsNested local_1aa0;
  LhsNested local_1a98;
  LhsNested local_1a90;
  LhsNested local_1a88;
  Matrix<double,__1,_1,_0,__1,_1> local_1a80;
  undefined1 local_1a70 [72];
  VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> local_1a28;
  Matrix<double,_6,_1,_0,_6,_1> local_19f0;
  Product<Eigen::Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_19c0 [2];
  LhsNested local_1988;
  LhsNested local_1950;
  LhsNested local_1918;
  LhsNested local_18e0;
  LhsNested local_18a8;
  ChMatrix33<double> local_1888;
  Matrix<double,_6,_6,_1,_6,_6> local_1840;
  Matrix<double,_6,_6,_1,_6,_6> local_1720;
  undefined1 local_1600 [16];
  DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *pDStack_15f0;
  variable_if_dynamic<long,__1> local_15e8;
  variable_if_dynamic<long,__1> vStack_15e0;
  double local_15d8;
  double local_14c8 [39];
  double local_1390 [39];
  double local_1258 [27];
  Matrix<double,_12,_12,_1,_12,_12> local_1180;
  Matrix<double,_12,_12,_1,_12,_12> local_d00;
  Matrix<double,_6,_6,_1,_6,_6> local_860;
  Matrix<double,_6,_6,_1,_6,_6> local_740;
  Matrix<double,_6,_6,_1,_6,_6> local_620;
  undefined1 local_500 [1232];
  
  peVar6 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1ae8 = eta;
  local_1ac0 = Mtorque;
  local_1ab8 = Fforce;
  if (peVar6 != (element_type *)0x0) {
    (*(peVar6->super_ChBeamSection)._vptr_ChBeamSection[2])();
    local_1a88 = (LhsNested)eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[4])();
    local_1a90 = (LhsNested)eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[5])();
    local_1a98 = (LhsNested)eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[3])();
    local_1aa0 = (LhsNested)eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[6])();
    local_1b00 = (undefined1  [8])eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[7])();
    local_1b30._0_8_ = eta;
    local_1b30._8_8_ = in_XMM0_Qb;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[8])();
    local_1b10 = (LhsNested)eta;
    uStack_1b08 = in_XMM0_Qb;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[9])();
    local_1ae0 = (LhsNested)eta;
    (*(((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChBeamSection)._vptr_ChBeamSection[10])();
    local_1600._0_8_ = local_1b00;
    register0x00001200 = ZEXT816(0) << 0x20;
    local_1b20._0_8_ = eta;
    local_1b20._8_8_ = in_XMM0_Qb;
    ChMatrix33<double>::Set_A_Rxyz(&local_1888,(ChVector<double> *)local_1600);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_1840);
    pDStack_15f0 = (DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_1840;
    local_15e8.m_value = 0;
    vStack_15e0.m_value = 0;
    local_15d8 = 2.96439387504748e-323;
    local_1600._0_8_ = (DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_1840;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_1600,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_1600._0_8_ =
         local_1840.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array + 0x15;
    local_15e8.m_value = 3;
    vStack_15e0.m_value = 3;
    local_15d8 = 2.96439387504748e-323;
    local_1b38 = this;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_1600,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_1600);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 0.0;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 0.0;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_1600;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_1600;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_14c8;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 1.48219693752374e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 1.48219693752374e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_1600;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_1390;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 2.96439387504748e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 2.96439387504748e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_1600;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_1258;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 4.44659081257122e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 4.44659081257122e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_1600;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
               &local_1888.super_Matrix<double,_3,_3,_1,_3,_3>);
    Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_620);
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4]
         = (double)local_1b10;
    auVar18._0_8_ = -(double)local_1b30._0_8_;
    auVar18._8_8_ = local_1b30._8_8_ ^ 0x8000000000000000;
    auVar33._0_8_ = -(double)local_1b10;
    auVar33._8_8_ = uStack_1b08 ^ 0x8000000000000000;
    local_1b00 = (undefined1  [8])0x8000000000000000;
    dStack_1af8 = -0.0;
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5]
         = (double)vmovlpd_avx(auVar18);
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
         = (double)vmovlpd_avx(auVar33);
    local_620.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = (double)local_1b30._0_8_;
    Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_true>::run
              (&local_d00);
    local_500._24_8_ = 0;
    local_500._32_8_ = 0;
    local_500._40_8_ = 5.92878775009496e-323;
    local_500._0_8_ = &local_d00;
    local_500._16_8_ = &local_d00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_500,&local_620)
    ;
    local_500._0_8_ =
         local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array + 0x4e;
    local_500._24_8_ = 6;
    local_500._32_8_ = 6;
    local_500._40_8_ = 5.92878775009496e-323;
    local_500._16_8_ = &local_d00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_500,&local_620)
    ;
    Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_740);
    auVar19._0_8_ = (ulong)local_1b00 ^ local_1b20._0_8_;
    auVar19._8_8_ = (ulong)dStack_1af8 ^ local_1b20._8_8_;
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9]
         = (double)vmovlpd_avx(auVar19);
    local_740.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = (double)local_1ae0;
    Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_true>::run
              ((Matrix<double,_12,_12,_1,_12,_12> *)local_500);
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 0.0;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 0.0;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)local_500;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_500;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1180,
               &local_740);
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)(local_500 + 0x270);
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[3] = 2.96439387504748e-323;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[4] = 2.96439387504748e-323;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[5] = 5.92878775009496e-323;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)local_500;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
              ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)&local_1180,
               &local_740);
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[0] = (double)&local_1840;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[1] = (double)&local_740;
    local_1180.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
    array[2] = (double)&local_620;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              (&local_860,
               (Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                *)&local_1180);
    pCVar12 = local_1b38;
    local_19c0[0].m_lhs.m_rhs = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
    local_19c0[0].m_lhs.m_lhs = (LhsNested)local_1600;
    local_19c0[0].m_rhs = &local_d00;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,0>>
              (&local_1180,local_19c0);
    iVar13 = (*(pCVar12->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
               _vptr_ChElementBase[3])(pCVar12);
    local_19c0[0].m_lhs.m_lhs._0_4_ = iVar13;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1a80,(int *)local_19c0);
    (*(pCVar12->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [6])(pCVar12,&local_1a80);
    local_19c0[0].m_lhs =
         (LhsNested)
         Eigen::MatrixBase<Eigen::Matrix<double,12,12,1,12,12>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,12,12,1,12,12>> *)&local_1180,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a80);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1b48,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_19c0);
    local_1b38 = (ChElementBeamEuler *)(pCVar12->super_ChElementBeam).length;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,0)
    ;
    local_1b20._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,6)
    ;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_1b20._0_8_;
    local_1ae0 = (LhsNested)(1.0 / (double)local_1b38);
    local_1ad0._0_8_ = (ulong)local_1ae0 ^ (ulong)local_1b00;
    local_1ad0._8_8_ = dStack_1af8;
    uStack_1ad8 = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (double)local_1ae0 * *pSVar14;
    auVar15 = vfmadd213sd_fma(auVar34,local_1ad0,auVar20);
    local_1a70._0_8_ = auVar15._0_8_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,1)
    ;
    local_1b20._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,7)
    ;
    local_1b30._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,5)
    ;
    local_1b10 = (LhsNested)*pSVar14;
    uStack_1b08 = 0;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,
                         0xb);
    auVar39._0_8_ = 6.0 / ((double)local_1b38 * (double)local_1b38);
    auVar39._8_8_ = 0;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_1b20._0_8_;
    auVar27._0_8_ = 12.0 / ((double)local_1b38 * (double)local_1b38 * (double)local_1b38);
    auVar27._8_8_ = 0;
    local_1a70._48_8_ = (ulong)auVar27._0_8_ ^ (ulong)local_1b00;
    local_1a70._56_8_ = dStack_1af8;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (double)local_1a70._48_8_ * (double)local_1b30._0_8_;
    auVar15 = vfmadd213sd_fma(auVar35,auVar27,auVar21);
    auVar10._8_8_ = uStack_1b08;
    auVar10._0_8_ = local_1b10;
    auVar7 = vfmadd213sd_fma(auVar10,auVar39,auVar15);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *pSVar14;
    auVar15 = vfmadd231sd_fma(auVar7,auVar39,auVar15);
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar15,auVar8);
    local_1a70._8_8_ = vmovlpd_avx(auVar15);
    local_1b30 = auVar27;
    local_1b20 = auVar39;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,2)
    ;
    local_1b10 = (LhsNested)*pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,8)
    ;
    local_1aa8 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,4)
    ;
    local_1ab0 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,10
                        );
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_1b10;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_1ab0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1a70._48_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_1aa8 * (double)local_1b30._0_8_;
    auVar15 = vfmadd132sd_fma(auVar28,auVar22,auVar7);
    auVar15 = vfmadd213sd_fma(auVar36,local_1b20,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *pSVar14;
    auVar15 = vfmadd231sd_fma(auVar15,local_1b20,auVar16);
    local_1a70._16_8_ = auVar15._0_8_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,3)
    ;
    local_1b30._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,9)
    ;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_1b30._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_1ad0._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (double)local_1ae0 * *pSVar14;
    auVar15 = vfmadd132sd_fma(auVar29,auVar23,auVar1);
    local_1a70._24_8_ = auVar15._0_8_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,2)
    ;
    local_1b30._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,8)
    ;
    local_1b10 = (LhsNested)*pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,4)
    ;
    local_1ad0._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,10
                        );
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_1ae8;
    auVar11._8_8_ = uStack_1ad8;
    auVar11._0_8_ = local_1ae0;
    dVar17 = (double)(local_1b20._0_8_ ^ (ulong)local_1b00);
    dStack_1af8 = 0.0;
    local_1b00 = (undefined1  [8])((double)local_1b20._0_8_ * local_1ae8);
    local_1ae0 = (LhsNested)(dVar17 * local_1ae8);
    auVar24._0_8_ = 3.0 / (double)local_1b38;
    auVar24._8_8_ = 0;
    auVar7 = vfmsub213sd_fma(auVar37,auVar24,auVar11);
    auVar15 = vfmadd213sd_fma(auVar37,auVar24,auVar11);
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(_local_1b00,auVar9);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_1b30._0_8_;
    local_1b38 = auVar7._0_8_;
    local_1ae8 = auVar15._0_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (double)local_1ae0 * (double)local_1b10;
    auVar16 = vfmsub213sd_fma(auVar40,auVar16,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_1ad0._0_8_;
    auVar7 = vfmadd213sd_fma(auVar31,auVar7,auVar16);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar14;
    auVar15 = vfmadd231sd_fma(auVar7,auVar15,auVar2);
    local_1a70._32_8_ = auVar15._0_8_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,1)
    ;
    local_1b20._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,7)
    ;
    local_1b30._0_8_ = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,5)
    ;
    local_1b10 = (LhsNested)*pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1b48,
                         0xb);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_1b20._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_1b10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_1b00;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (double)local_1b30._0_8_ * (double)local_1ae0;
    auVar15 = vfmadd132sd_fma(auVar32,auVar25,auVar3);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_1ae8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1b38;
    auVar15 = vfmadd132sd_fma(auVar38,auVar15,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pSVar14;
    auVar15 = vfmadd231sd_fma(auVar15,auVar26,auVar5);
    local_1a70._40_8_ = auVar15._0_8_;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_19c0);
    local_19c0[0].m_lhs.m_lhs = local_1a88;
    local_1988 = local_1a98;
    local_1950 = local_1a90;
    local_1918 = local_1aa0;
    local_18e0 = local_1a90;
    local_18a8 = local_1a98;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_1720);
    local_1a28.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_data =
         (PointerType)&local_860;
    local_1a28.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = (long)local_19c0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              (&local_1720,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
                *)&local_1a28);
    local_1a28.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = (long)local_1a70;
    local_1a28.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_data =
         (PointerType)&local_1720;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_19f0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)&local_1a28);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              (&local_1a28,&local_19f0,0,3);
    ChVector<double>::operator=
              (local_1ab8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1a28);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              (&local_1a28,&local_19f0,3,3);
    ChVector<double>::operator=
              (local_1ac0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1a28);
    Eigen::internal::handmade_aligned_free(local_1b48[0]);
    Eigen::internal::handmade_aligned_free
              (local_1a80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                ,0x361,
                "virtual void chrono::fea::ChElementBeamEuler::EvaluateSectionForceTorque(const double, ChVector<> &, ChVector<> &)"
               );
}

Assistant:

void ChElementBeamEuler::EvaluateSectionForceTorque(const double eta, ChVector<>& Fforce, ChVector<>& Mtorque) {
    assert(section);

    double EA = this->section->GetAxialRigidity();
    double EIyy = this->section->GetYbendingRigidity();
    double EIzz = this->section->GetZbendingRigidity();
    double GJ = this->section->GetXtorsionRigidity();
    double alpha = this->section->GetSectionRotation();
    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    // The shear center offset is respect to the centerline.
    // In case the section has a shear center displacement:
    //Sy = Sy - Cy;   // Unnecessary to do this substraction
    //Sz = Sz - Cz;

    ChMatrix33<> Rotsect0;
    Rotsect0.Set_A_Rxyz(ChVector<>(alpha, 0, 0));
    ChMatrixNM<double, 6, 6> RotsectA;
    RotsectA.setZero();
    RotsectA.block<3, 3>(0, 0) = Rotsect0;
    RotsectA.block<3, 3>(3, 3) = Rotsect0;
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = Rotsect0;
    Rotsect.block<3, 3>(3, 3) = Rotsect0;
    Rotsect.block<3, 3>(6, 6) = Rotsect0;
    Rotsect.block<3, 3>(9, 9) = Rotsect0;

    ChMatrixNM<double, 6, 6> TcA;
    TcA.setIdentity();
    TcA(0, 4) = Cz;
    TcA(0, 5) = -Cy;
    TcA(1, 3) = -Cz;
    TcA(2, 3) = Cy;
    ChMatrixNM<double, 12, 12> Tc;
    Tc.setIdentity();
    Tc.block<6, 6>(0, 0) = TcA;
    Tc.block<6, 6>(6, 6) = TcA;

    ChMatrixNM<double, 6, 6> TsA;
    TsA.setIdentity();
    TsA(1, 3) = -Sz;
    TsA(2, 3) = Sy;
    ChMatrixNM<double, 12, 12> Ts;
    Ts.setIdentity();
    Ts.block<6, 6>(0, 0) = TsA;
    Ts.block<6, 6>(6, 6) = TsA;


    ChMatrixNM<double, 6, 6> TA;
    TA = RotsectA * TsA * TcA;
    ChMatrixNM<double, 12, 12> T;
    T = Rotsect * Ts * Tc;

    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    ChVectorDynamic<> displ_ec = T * displ;

    // ShapeVector N;
    // ShapeFunctions(N, eta);  // Evaluate compressed shape functions

    // shape function derivatives are computed here on-the-fly
    double dN_xa = -(1. / length);
    double dN_xb = (1. / length);
    double ddN_ua = (6. / (length * length)) * (eta);
    double ddN_ub = -(6. / (length * length)) * (eta);
    double ddN_ra = -(1. / length) + ((3.0 / length) * eta);
    double ddN_rb = (1. / length) + ((3.0 / length) * eta);
    double dddN_ua = (12. / (length * length * length));
    double dddN_ub = -(12. / (length * length * length));
    double dddN_ra = (6.0 / (length * length));
    double dddN_rb = (6.0 / (length * length));

    // generalized strains/curvatures;
    ChVectorN<double, 6> sect_ek;

    // e_x
    sect_ek(0) = (dN_xa * displ_ec(0) + dN_xb * displ_ec(6));  // x_a   x_b
    // e_y
    sect_ek(1) = (dddN_ua * displ_ec(1) + dddN_ub * displ_ec(7) +  // y_a   y_b
                  dddN_ra * displ_ec(5) + dddN_rb * displ_ec(11));  // Rz_a  Rz_b
    sect_ek(1) *= -1.0;
    // e_z
    sect_ek(2) = (-dddN_ua * displ_ec(2) - dddN_ub * displ_ec(8) +  // z_a   z_b   note - sign
                  dddN_ra * displ_ec(4) + dddN_rb * displ_ec(10));  // Ry_a  Ry_b
    
    // k_x
    sect_ek(3) = (dN_xa * displ_ec(3) + dN_xb * displ_ec(9));  // Rx_a  Rx_b
    // k_y
    sect_ek(4) = (-ddN_ua * displ_ec(2) - ddN_ub * displ_ec(8) +  // z_a   z_b   note - sign
                  ddN_ra * displ_ec(4) + ddN_rb * displ_ec(10));  // Ry_a  Ry_b
    // k_z
    sect_ek(5) = (ddN_ua * displ_ec(1) + ddN_ub * displ_ec(7) +  // y_a   y_b
                  ddN_ra * displ_ec(5) + ddN_rb * displ_ec(11));  // Rz_a  Rz_b

    if (false)  // section->alpha ==0 && section->Cy ==0 && section->Cz==0 && section->Sy==0 && section->Sz==0)
    {
        // Fast computation:
        Fforce.x() = EA   * sect_ek(0);
        Fforce.y() = EIzz * sect_ek(1);
        Fforce.z() = EIyy * sect_ek(2);

        Mtorque.x() = GJ   * sect_ek(3);
        Mtorque.y() = EIyy * sect_ek(4);
        Mtorque.z() = EIzz * sect_ek(5);
    } else {
        // Generic computation, by rotating and translating the constitutive
        // matrix of the beam:
        ChMatrixNM<double, 6, 6> Klaw_d;
        Klaw_d.setZero();
        Klaw_d(0, 0) = EA;
        Klaw_d(1, 1) = EIzz;
        Klaw_d(2, 2) = EIyy;
        Klaw_d(3, 3) = GJ;
        Klaw_d(4, 4) = EIyy;
        Klaw_d(5, 5) = EIzz;

        // ..unrolled rotated constitutive matrix..
        ChMatrixNM<double, 6, 6> Klaw_r;
        Klaw_r.setZero();
        Klaw_r = TA.transpose() * Klaw_d;

        // .. compute wrench = Klaw_l * sect_ek
        ChVectorN<double, 6> wrench = Klaw_r * sect_ek;
        Fforce = wrench.segment(0, 3);
        Mtorque = wrench.segment(3, 3);

    }
}